

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_list_expr(gvisitor_t *self,gnode_list_expr_t *node)

{
  ulong uVar1;
  uint uVar2;
  _Bool _Var3;
  long *plVar4;
  ircode_t *code;
  uint p2;
  _Bool _Var5;
  uint32_t p1;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  uint32_t uVar11;
  long lVar12;
  gnode_t *node_00;
  uint32_t uVar13;
  ulong uVar14;
  long local_48;
  
  plVar4 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if ((plVar4 == (long *)0x0) || ((gravity_class_t *)*plVar4 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
    return;
  }
  code = (ircode_t *)plVar4[0x14];
  _Var3 = node->ismap;
  uVar6 = 0;
  uVar13 = 0;
  if (node->list1 != (gnode_r *)0x0) {
    uVar13 = (uint32_t)node->list1->n;
  }
  p1 = ircode_register_push_temp(code);
  if (node != (gnode_list_expr_t *)0x0) {
    uVar6 = (node->base).token.lineno;
  }
  uVar7 = 0;
  ircode_add(code,LISTNEW - _Var3,p1,uVar13,0,uVar6);
  if (uVar13 == 0) {
    return;
  }
  if (node != (gnode_list_expr_t *)0x0) {
    uVar7 = (node->base).token.lineno;
  }
  uVar2 = (uint)(_Var3 ^ 1) * 0x40 + 0x40;
  ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,0,uVar7);
  uVar8 = 0;
  do {
    p2 = uVar13 - uVar8;
    if (uVar2 <= uVar13 - uVar8) {
      p2 = uVar2;
    }
    ircode_push_context(code);
    if (uVar13 != uVar8) {
      uVar14 = (ulong)uVar8;
      uVar9 = p2 + uVar14;
      local_48 = 1;
      do {
        if (uVar14 < node->list1->n) {
          node_00 = node->list1->p[uVar14];
        }
        else {
          node_00 = (gnode_t *)0x0;
        }
        gvisit(self,node_00);
        uVar6 = ircode_register_pop_context_protect(code,true);
        if (uVar6 == 0xffffffff) {
LAB_0013c2a4:
          pcVar10 = "Invalid list expression.";
LAB_0013c2b1:
          report_error(self,node_00,pcVar10);
        }
        else {
          if (uVar6 <= p1) {
            _Var5 = ircode_register_istemp(code,uVar6);
            if (_Var5) goto LAB_0013c2a4;
          }
          uVar1 = local_48 + (ulong)p1;
          if (uVar1 == uVar6) {
LAB_0013c331:
            lVar12 = 1;
            if (_Var3 != false) {
              if (uVar14 < node->list2->n) {
                node_00 = node->list2->p[uVar14];
              }
              else {
                node_00 = (gnode_t *)0x0;
              }
              if (node == (gnode_list_expr_t *)0x0) {
                uVar6 = 0;
                ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,1,0);
                gvisit(self,node_00);
              }
              else {
                ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,1,(node->base).token.lineno);
                gvisit(self,node_00);
                uVar6 = (node->base).token.lineno;
              }
              ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,0,uVar6);
              uVar6 = ircode_register_pop_context_protect(code,true);
              if (uVar6 == 0xffffffff) {
LAB_0013c3ea:
                pcVar10 = "Invalid map expression.";
                goto LAB_0013c2b1;
              }
              if (uVar6 <= p1) {
                _Var5 = ircode_register_istemp(code,uVar6);
                if (_Var5) goto LAB_0013c3ea;
              }
              lVar12 = 2;
              if (uVar1 + 1 != (ulong)uVar6) {
                uVar7 = ircode_register_push_temp(code);
                if (node == (gnode_list_expr_t *)0x0) {
                  uVar11 = 0;
                }
                else {
                  uVar11 = (node->base).token.lineno;
                }
                ircode_add(code,MOVE,uVar7,uVar6,0,uVar11);
                ircode_register_clear(code,uVar6);
                uVar6 = ircode_register_pop_context_protect(code,true);
                if (uVar6 == 0xffffffff) goto LAB_0013c47a;
                if (uVar1 + 1 != (ulong)uVar7) goto LAB_0013c48e;
              }
            }
            local_48 = local_48 + lVar12;
          }
          else {
            uVar7 = ircode_register_push_temp(code);
            if (node == (gnode_list_expr_t *)0x0) {
              uVar11 = 0;
            }
            else {
              uVar11 = (node->base).token.lineno;
            }
            ircode_add(code,MOVE,uVar7,uVar6,0,uVar11);
            ircode_register_clear(code,uVar6);
            uVar6 = ircode_register_pop_context_protect(code,true);
            if (uVar6 == 0xffffffff) {
LAB_0013c47a:
              pcVar10 = "Unexpected register error.";
            }
            else {
              if (uVar1 == uVar7) goto LAB_0013c331;
LAB_0013c48e:
              pcVar10 = "Unexpected register computation.";
            }
            report_error(self,node_00,pcVar10);
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar9);
    }
    if (node == (gnode_list_expr_t *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (node->base).token.lineno;
    }
    uVar8 = uVar8 + p2;
    ircode_add(code,SETLIST,p1,p2,0,uVar6);
    ircode_pop_context(code);
    if (uVar13 <= uVar8) {
      if (node == (gnode_list_expr_t *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar13 = (node->base).token.lineno;
      }
      ircode_pragma(code,PRAGMA_MOVE_OPTIMIZATION,1,uVar13);
      return;
    }
  } while( true );
}

Assistant:

static void visit_list_expr (gvisitor_t *self, gnode_list_expr_t *node) {
    DEBUG_CODEGEN("visit_list_expr");
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    bool     ismap = node->ismap;
    uint32_t n = (uint32_t)gnode_array_size(node->list1);

    // a map requires twice registers than a list
    uint32_t max_fields = (ismap) ? MAX_FIELDSxFLUSH : MAX_FIELDSxFLUSH*2;

    // destination register of a new instruction is ALWAYS a temp register
    // then the optimizer could decide to optimize and merge the step
    uint32_t dest = ircode_register_push_temp(code);
	ircode_add(code, (ismap) ? MAPNEW : LISTNEW, dest, n, 0, LINE_NUMBER(node));
    if (n == 0) return;

    // this is just like Lua "fields per flush"
    // basically nodes are processed in a finite chunk
    // and then added to the list/map
    uint32_t nloops = n / max_fields;
    if (n % max_fields != 0) ++nloops;
    uint32_t nprocessed = 0;

	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
    while (nprocessed < n) {
        size_t k = (n - nprocessed > max_fields) ? max_fields : (n - nprocessed);
        size_t idxstart = nprocessed;
        size_t idxend = nprocessed + k;
        nprocessed += (uint32_t)k;

        // check if this chunk can be optimized
        // if (check_literals_list(self, node, ismap, idxstart, idxend, dest)) continue;

        // save register context
        ircode_push_context(code);

        // process each node
        for (size_t i=1, j=idxstart; j<idxend; ++j) {
            gnode_t *e = gnode_array_get(node->list1, j);
            visit(e);
            uint32_t nreg = ircode_register_pop_context_protect(code, true);
            if ((nreg == REGISTER_ERROR) || ((nreg <= dest) && (ircode_register_istemp(code, nreg)))) {
                report_error(self, (gnode_t *)e, "Invalid list expression.");
                continue;
            }

            if (nreg != dest + i) {
                uint32_t temp_register = ircode_register_push_temp(code);
				ircode_add(code, MOVE, temp_register, nreg, 0, LINE_NUMBER(node));
                ircode_register_clear(code, nreg);
                uint32_t temp = ircode_register_pop_context_protect(code, true);
                if (temp == REGISTER_ERROR) {report_error(self, (gnode_t *)e, "Unexpected register error."); continue;}
                if (temp_register != dest + i) {report_error(self, (gnode_t *)e, "Unexpected register computation."); continue;}
            }

            if (ismap) {
                e = gnode_array_get(node->list2, j);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
                visit(e);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
                nreg = ircode_register_pop_context_protect(code, true);
                if ((nreg == REGISTER_ERROR) || ((nreg <= dest) && (ircode_register_istemp(code, nreg)))) {
                    report_error(self, (gnode_t *)e, "Invalid map expression.");
                    continue;
                }

                if (nreg != dest + i + 1) {
                    uint32_t temp_register = ircode_register_push_temp(code);
					ircode_add(code, MOVE, temp_register, nreg, 0, LINE_NUMBER(node));
                    ircode_register_clear(code, nreg);
                    uint32_t temp = ircode_register_pop_context_protect(code, true);
                    if (temp == REGISTER_ERROR) {report_error(self, (gnode_t *)e, "Unexpected register error."); continue;}
                    if (temp_register != dest + i + 1) {report_error(self, (gnode_t *)e, "Unexpected register computation."); continue;}
                }
            }

            i += (ismap) ? 2 : 1;
        }

        // emit proper SETLIST instruction
        // since in a map registers are always used in pairs (key, value) it is
        // extremely easier to just set reg1 to be always 0 and use r in a loop
		ircode_add(code, SETLIST, dest, (uint32_t)(idxend-idxstart), 0, LINE_NUMBER(node));

        // restore register context
        ircode_pop_context(code);
    }

	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}